

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O0

void Cec3_CollectSuper(Gia_Obj_t *pObj,int fUseMuxes,Vec_Ptr_t *vSuper)

{
  int iVar1;
  Vec_Ptr_t *vSuper_local;
  int fUseMuxes_local;
  Gia_Obj_t *pObj_local;
  
  iVar1 = Gia_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Gia_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                  ,300,"void Cec3_CollectSuper(Gia_Obj_t *, int, Vec_Ptr_t *)");
  }
  iVar1 = Gia_ObjIsCi(pObj);
  if (iVar1 == 0) {
    Vec_PtrClear(vSuper);
    Cec3_CollectSuper_rec(pObj,vSuper,1,fUseMuxes);
    return;
  }
  __assert_fail("!Gia_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                ,0x12d,"void Cec3_CollectSuper(Gia_Obj_t *, int, Vec_Ptr_t *)");
}

Assistant:

void Cec3_CollectSuper( Gia_Obj_t * pObj, int fUseMuxes, Vec_Ptr_t * vSuper )
{
    assert( !Gia_IsComplement(pObj) );
    assert( !Gia_ObjIsCi(pObj) );
    Vec_PtrClear( vSuper );
    Cec3_CollectSuper_rec( pObj, vSuper, 1, fUseMuxes );
}